

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

unsigned_long_long qpdf_oh_get_uint_value(qpdf_data qpdf,qpdf_oh oh)

{
  unsigned_long_long uVar1;
  anon_class_1_0_00000001 local_61;
  function<unsigned_long_long_(QPDFObjectHandle_&)> local_60;
  unsigned_long_long local_40;
  function<unsigned_long_long_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_40 = 0;
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<unsigned_long_long>(&local_38,&local_40);
  std::function<unsigned_long_long(QPDFObjectHandle&)>::function<qpdf_oh_get_uint_value::__0,void>
            ((function<unsigned_long_long(QPDFObjectHandle&)> *)&local_60,&local_61);
  uVar1 = do_with_oh<unsigned_long_long>(qpdf,oh,&local_38,&local_60);
  std::function<unsigned_long_long_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<unsigned_long_long_()>::~function(&local_38);
  return uVar1;
}

Assistant:

unsigned long long
qpdf_oh_get_uint_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<unsigned long long>(
        qpdf, oh, return_T<unsigned long long>(0ULL), [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_uint_value");
            return o.getUIntValue();
        });
}